

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3UpsertAnalyzeTarget(Parse *pParse,SrcList *pTabList,Upsert *pUpsert)

{
  Table *pTVar1;
  ExprList *pEVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  ExprList_item *pEVar7;
  int iVar8;
  Index *pIVar9;
  Expr *pEVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char zWhich [16];
  Expr sCol [2];
  char local_118 [24];
  NameContext local_100;
  Expr local_c8;
  Expr local_80;
  
  local_100.uNC.pEList = (ExprList *)0x0;
  local_100.pNext = (NameContext *)0x0;
  local_100.nRef = 0;
  local_100.nNcErr = 0;
  local_100.ncFlags = 0;
  local_100._44_4_ = 0;
  local_100.pWinSelect = (Select *)0x0;
  if (pUpsert != (Upsert *)0x0) {
    iVar8 = 0;
    local_100.pParse = pParse;
    local_100.pSrcList = pTabList;
    do {
      if (pUpsert->pUpsertTarget == (ExprList *)0x0) {
        return 0;
      }
      iVar3 = sqlite3ResolveExprListNames(&local_100,pUpsert->pUpsertTarget);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = sqlite3ResolveExprNames(&local_100,pUpsert->pUpsertTargetWhere);
      if (iVar3 != 0) {
        return 1;
      }
      pTVar1 = pTabList->a[0].pTab;
      pEVar2 = pUpsert->pUpsertTarget;
      iVar3 = pTabList->a[0].iCursor;
      if (((((pTVar1->tabFlags & 0x80) != 0) || (pEVar2->nExpr != 1)) ||
          (pEVar10 = pEVar2->a[0].pExpr, pEVar10->op != 0xa7)) || (pEVar10->iColumn != -1)) {
        memset(&local_c8,0,0x90);
        local_c8.op = 'q';
        local_c8.pLeft = &local_80;
        local_80.op = 0xa7;
        pIVar9 = pTVar1->pIndex;
        local_80.iTable = iVar3;
        if (pIVar9 != (Index *)0x0) {
          do {
            if ((pIVar9->onError != '\0') && (uVar6 = pIVar9->nKeyCol, pEVar2->nExpr == (uint)uVar6)
               ) {
              if (pIVar9->pPartIdxWhere != (Expr *)0x0) {
                if ((pUpsert->pUpsertTargetWhere == (Expr *)0x0) ||
                   (iVar4 = sqlite3ExprCompare(pParse,pUpsert->pUpsertTargetWhere,
                                               pIVar9->pPartIdxWhere,iVar3), iVar4 != 0))
                goto LAB_001b331d;
                uVar6 = pIVar9->nKeyCol;
              }
              if (uVar6 != 0) {
                uVar11 = (ulong)uVar6;
                uVar13 = 0;
                do {
                  local_c8.u = *(anon_union_8_2_443a03b8_for_u *)(pIVar9->azColl + uVar13);
                  pEVar7 = pEVar2->a;
                  uVar12 = uVar11;
                  if (pIVar9->aiColumn[uVar13] == -2) {
                    pEVar10 = pIVar9->aColExpr->a[uVar13].pExpr;
                    if (pEVar10->op != 'q') goto LAB_001b339b;
                  }
                  else {
                    pEVar10 = &local_80;
                    local_80.iColumn = pIVar9->aiColumn[uVar13];
LAB_001b339b:
                    local_c8.pLeft = pEVar10;
                    pEVar10 = &local_c8;
                  }
                  while (uVar5 = sqlite3ExprCompare(pParse,pEVar7->pExpr,pEVar10,iVar3), 1 < uVar5)
                  {
                    uVar12 = uVar12 - 1;
                    pEVar7 = pEVar7 + 1;
                    if (uVar12 == 0) goto LAB_001b331d;
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar11);
              }
              pUpsert->pUpsertIdx = pIVar9;
              break;
            }
LAB_001b331d:
            pIVar9 = pIVar9->pNext;
          } while (pIVar9 != (Index *)0x0);
        }
        if (pUpsert->pUpsertIdx == (Index *)0x0) {
          if ((iVar8 == 0) && (pUpsert->pNextUpsert == (Upsert *)0x0)) {
            local_118[0] = '\0';
          }
          else {
            sqlite3_snprintf(0x10,local_118,"%r ",(ulong)(iVar8 + 1));
          }
          sqlite3ErrorMsg(pParse,
                          "%sON CONFLICT clause does not match any PRIMARY KEY or UNIQUE constraint"
                          ,local_118);
          return 1;
        }
      }
      pUpsert = pUpsert->pNextUpsert;
      iVar8 = iVar8 + 1;
    } while (pUpsert != (Upsert *)0x0);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3UpsertAnalyzeTarget(
  Parse *pParse,     /* The parsing context */
  SrcList *pTabList, /* Table into which we are inserting */
  Upsert *pUpsert    /* The ON CONFLICT clauses */
){
  Table *pTab;            /* That table into which we are inserting */
  int rc;                 /* Result code */
  int iCursor;            /* Cursor used by pTab */
  Index *pIdx;            /* One of the indexes of pTab */
  ExprList *pTarget;      /* The conflict-target clause */
  Expr *pTerm;            /* One term of the conflict-target clause */
  NameContext sNC;        /* Context for resolving symbolic names */
  Expr sCol[2];           /* Index column converted into an Expr */
  int nClause = 0;        /* Counter of ON CONFLICT clauses */

  assert( pTabList->nSrc==1 );
  assert( pTabList->a[0].pTab!=0 );
  assert( pUpsert!=0 );
  assert( pUpsert->pUpsertTarget!=0 );

  /* Resolve all symbolic names in the conflict-target clause, which
  ** includes both the list of columns and the optional partial-index
  ** WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  for(; pUpsert && pUpsert->pUpsertTarget;
        pUpsert=pUpsert->pNextUpsert, nClause++){
    rc = sqlite3ResolveExprListNames(&sNC, pUpsert->pUpsertTarget);
    if( rc ) return rc;
    rc = sqlite3ResolveExprNames(&sNC, pUpsert->pUpsertTargetWhere);
    if( rc ) return rc;

    /* Check to see if the conflict target matches the rowid. */
    pTab = pTabList->a[0].pTab;
    pTarget = pUpsert->pUpsertTarget;
    iCursor = pTabList->a[0].iCursor;
    if( HasRowid(pTab)
     && pTarget->nExpr==1
     && (pTerm = pTarget->a[0].pExpr)->op==TK_COLUMN
     && pTerm->iColumn==XN_ROWID
    ){
      /* The conflict-target is the rowid of the primary table */
      assert( pUpsert->pUpsertIdx==0 );
      continue;
    }

    /* Initialize sCol[0..1] to be an expression parse tree for a
    ** single column of an index.  The sCol[0] node will be the TK_COLLATE
    ** operator and sCol[1] will be the TK_COLUMN operator.  Code below
    ** will populate the specific collation and column number values
    ** prior to comparing against the conflict-target expression.
    */
    memset(sCol, 0, sizeof(sCol));
    sCol[0].op = TK_COLLATE;
    sCol[0].pLeft = &sCol[1];
    sCol[1].op = TK_COLUMN;
    sCol[1].iTable = pTabList->a[0].iCursor;

    /* Check for matches against other indexes */
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int ii, jj, nn;
      if( !IsUniqueIndex(pIdx) ) continue;
      if( pTarget->nExpr!=pIdx->nKeyCol ) continue;
      if( pIdx->pPartIdxWhere ){
        if( pUpsert->pUpsertTargetWhere==0 ) continue;
        if( sqlite3ExprCompare(pParse, pUpsert->pUpsertTargetWhere,
                               pIdx->pPartIdxWhere, iCursor)!=0 ){
          continue;
        }
      }
      nn = pIdx->nKeyCol;
      for(ii=0; ii<nn; ii++){
        Expr *pExpr;
        sCol[0].u.zToken = (char*)pIdx->azColl[ii];
        if( pIdx->aiColumn[ii]==XN_EXPR ){
          assert( pIdx->aColExpr!=0 );
          assert( pIdx->aColExpr->nExpr>ii );
          assert( pIdx->bHasExpr );
          pExpr = pIdx->aColExpr->a[ii].pExpr;
          if( pExpr->op!=TK_COLLATE ){
            sCol[0].pLeft = pExpr;
            pExpr = &sCol[0];
          }
        }else{
          sCol[0].pLeft = &sCol[1];
          sCol[1].iColumn = pIdx->aiColumn[ii];
          pExpr = &sCol[0];
        }
        for(jj=0; jj<nn; jj++){
          if( sqlite3ExprCompare(pParse,pTarget->a[jj].pExpr,pExpr,iCursor)<2 ){
            break;  /* Column ii of the index matches column jj of target */
          }
        }
        if( jj>=nn ){
          /* The target contains no match for column jj of the index */
          break;
        }
      }
      if( ii<nn ){
        /* Column ii of the index did not match any term of the conflict target.
        ** Continue the search with the next index. */
        continue;
      }
      pUpsert->pUpsertIdx = pIdx;
      break;
    }
    if( pUpsert->pUpsertIdx==0 ){
      char zWhich[16];
      if( nClause==0 && pUpsert->pNextUpsert==0 ){
        zWhich[0] = 0;
      }else{
        sqlite3_snprintf(sizeof(zWhich),zWhich,"%r ", nClause+1);
      }
      sqlite3ErrorMsg(pParse, "%sON CONFLICT clause does not match any "
                              "PRIMARY KEY or UNIQUE constraint", zWhich);
      return SQLITE_ERROR;
    }
  }
  return SQLITE_OK;
}